

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O3

void amrex::EB_average_down_faces
               (Array<const_MultiFab_*,_3> *fine,Array<MultiFab_*,_3> *crse,IntVect *ratio,
               Geometry *crse_geom)

{
  uint ncomp;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> _Var1;
  FabArray<amrex::FArrayBox> *this;
  long lVar2;
  MultiFab *pMVar3;
  FabArray<amrex::FArrayBox> *src;
  int idim;
  Periodicity local_558;
  Geometry *local_548;
  undefined1 local_540 [8];
  ulong local_538;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_530;
  BoxArray cba;
  Array<MultiFab,_3> ctmp;
  
  _Var1._M_head_impl =
       (fine->_M_elems[0]->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  local_548 = crse_geom;
  if (_Var1._M_head_impl != (FabFactory<amrex::FArrayBox> *)0x0) {
    lVar2 = __dynamic_cast(_Var1._M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo,0);
    if (lVar2 != 0) {
      ncomp = (crse->_M_elems[0]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
      lVar2 = 0;
      do {
        MultiFab::MultiFab((MultiFab *)
                           ((long)&ctmp._M_elems[0].super_FabArray<amrex::FArrayBox>.
                                   super_FabArrayBase._vptr_FabArrayBase + lVar2));
        lVar2 = lVar2 + 0x180;
      } while (lVar2 != 0x480);
      pMVar3 = ctmp._M_elems;
      lVar2 = 0;
      do {
        BoxArray::BoxArray(&cba,&(fine->_M_elems[lVar2]->super_FabArray<amrex::FArrayBox>).
                                 super_FabArrayBase.boxarray);
        BoxArray::coarsen(&cba,ratio);
        local_540._0_4_ = 1;
        local_540._4_4_ = 0;
        vStack_530.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_530.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_538 = 0;
        vStack_530.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_558.period.vect._0_8_ = &PTR__FabFactory_00712918;
        (*(((MultiFab *)&pMVar3->super_FabArray<amrex::FArrayBox>)->super_FabArray<amrex::FArrayBox>
          ).super_FabArrayBase._vptr_FabArrayBase[2])
                  (pMVar3,&cba,
                   &(fine->_M_elems[lVar2]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                    distributionMap,(ulong)ncomp,0,local_540,&local_558);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vStack_530);
        BoxArray::~BoxArray(&cba);
        lVar2 = lVar2 + 1;
        pMVar3 = pMVar3 + 1;
      } while (lVar2 != 3);
      src = (FabArray<amrex::FArrayBox> *)&ctmp;
      cba.m_bat.m_op._4_8_ = ctmp._M_elems + 1;
      cba.m_bat.m_op._12_8_ = ctmp._M_elems + 2;
      cba.m_bat._0_8_ = src;
      EB_average_down_faces(fine,(Array<MultiFab_*,_3> *)&cba,ratio,0);
      lVar2 = 0;
      do {
        this = &crse->_M_elems[lVar2]->super_FabArray<amrex::FArrayBox>;
        local_558 = Geometry::periodicity(local_548);
        cba.m_bat._0_8_ = 0;
        cba.m_bat.m_op._4_8_ = cba.m_bat.m_op._4_8_ & 0xffffffff00000000;
        local_540._0_4_ = 0;
        local_540._4_4_ = 0;
        local_538 = local_538 & 0xffffffff00000000;
        FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                  (this,src,0,0,ncomp,(IntVect *)&cba,(IntVect *)local_540,&local_558,COPY,
                   (CPC *)0x0,false);
        lVar2 = lVar2 + 1;
        src = src + 1;
      } while (lVar2 != 3);
      lVar2 = 0x300;
      do {
        MultiFab::~MultiFab((MultiFab *)
                            ((long)&ctmp._M_elems[0].super_FabArray<amrex::FArrayBox>.
                                    super_FabArrayBase._vptr_FabArrayBase + lVar2));
        lVar2 = lVar2 + -0x180;
      } while (lVar2 != -0x180);
      return;
    }
  }
  average_down_faces(fine,crse,ratio,local_548);
  return;
}

Assistant:

void EB_average_down_faces (const Array<const MultiFab*,AMREX_SPACEDIM>& fine,
                            const Array<MultiFab*,AMREX_SPACEDIM>& crse,
                            const IntVect& ratio, const Geometry& crse_geom)
{
    AMREX_ASSERT(crse[0]->nComp() == fine[0]->nComp());

    if (!(*fine[0]).hasEBFabFactory())
    {
        amrex::average_down_faces(fine, crse, ratio, crse_geom);
    }
    else
    {
        int ngcrse = 0;
        int ncomp = crse[0]->nComp();
        Array<MultiFab,AMREX_SPACEDIM> ctmp;
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            BoxArray cba = fine[idim]->boxArray();
            cba.coarsen(ratio);
            ctmp[idim].define(cba, fine[idim]->DistributionMap(), ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
        }
        EB_average_down_faces(fine, amrex::GetArrOfPtrs(ctmp), ratio, ngcrse);
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            crse[idim]->ParallelCopy(ctmp[idim],0,0,ncomp,crse_geom.periodicity());
        }
    }
}